

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ban.c
# Opt level: O0

void do_unban(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  char *in_RSI;
  CHAR_DATA *in_RDI;
  int res;
  char *unaff_retaddr;
  
  if (*in_RSI == '\0') {
    send_to_char(unaff_retaddr,in_RDI);
  }
  else {
    iVar1 = CSQLInterface::Delete(&RS.SQL,"bans WHERE site LIKE \'%%%s%%\'",in_RSI);
    if (iVar1 == 0) {
      send_to_char(unaff_retaddr,in_RDI);
    }
    else {
      send_to_char(unaff_retaddr,in_RDI);
    }
  }
  return;
}

Assistant:

void do_unban(CHAR_DATA *ch, char *argument)
{
	if (argument[0] == '\0')
	{
		send_to_char("Remove which site from the ban list?\n\r", ch);
		return;
	}

	auto res = RS.SQL.Delete("bans WHERE site LIKE \'%%%s%%\'", argument);
	if (res)
		send_to_char("Site unbanned.\n\r", ch);
	else
		send_to_char("Site is not banned.\n\r", ch);
}